

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O2

int Bmcg_ManPerformOne(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  Gia_Man_t *p;
  uint f;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int f_00;
  abctime clkStart;
  Bmcg_Man_t *p_00;
  Cnf_Dat_t *pCnf;
  abctime aVar5;
  Gia_Obj_t *pObj;
  abctime aVar6;
  Abc_Cex_t *pAVar7;
  Vec_Int_t *pVVar8;
  int nClauses;
  int nClauses_00;
  int nClauses_01;
  Bmcg_Man_t *p_01;
  ulong uVar9;
  int iVar10;
  uint i;
  int local_60;
  int local_5c;
  int iLit;
  Abc_Cex_t **local_40;
  Vec_Int_t *local_38;
  
  clkStart = Abc_Clock();
  p_00 = Bmcg_ManStart(pGia,pPars);
  p_01 = (Bmcg_Man_t *)&pGia->pCexSeq;
  local_40 = (Abc_Cex_t **)p_01;
  Abc_CexFreeP((Abc_Cex_t **)p_01);
  local_38 = &p_00->vFr2Sat;
  local_60 = -1;
  iVar10 = 0;
  f_00 = 0;
  while( true ) {
    iVar2 = (int)p_01;
    if ((pPars->nFramesMax != 0) && (pPars->nFramesMax <= f_00)) break;
    pCnf = Bmcg_ManAddNewCnf(p_00,f_00,pPars->nFramesAdd);
    if (pCnf == (Cnf_Dat_t *)0x0) {
      p_01 = p_00;
      Bmcg_ManPrintFrame(p_00,f_00,nClauses,-1,clkStart);
      if (pPars->pFuncOnFrameDone == (_func_void_int_int_int *)0x0) {
        iVar1 = pPars->nFramesAdd;
      }
      else {
        for (iVar10 = 0; iVar1 = pPars->nFramesAdd, iVar10 < iVar1; iVar10 = iVar10 + 1) {
          for (iVar2 = 0; iVar2 < pGia->vCos->nSize - pGia->nRegs; iVar2 = iVar2 + 1) {
            p_01 = (Bmcg_Man_t *)(ulong)(uint)(iVar10 + f_00);
            (*pPars->pFuncOnFrameDone)(iVar10 + f_00,iVar2,0);
          }
        }
      }
    }
    else {
      Bmcg_ManAddCnf(p_00,p_00->pSats[0],pCnf);
      Cnf_DataFree(pCnf);
      iVar1 = pPars->nFramesAdd;
      p_01 = (Bmcg_Man_t *)(ulong)(uint)(iVar1 + f_00);
      pVVar8 = pGia->vCos;
      iVar2 = pGia->nRegs;
      if (p_00->pFrames->vCos->nSize - p_00->pFrames->nRegs !=
          (pVVar8->nSize - iVar2) * (iVar1 + f_00)) {
        __assert_fail("Gia_ManPoNum(p->pFrames) == (f + pPars->nFramesAdd) * Gia_ManPoNum(pGia)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcG.c"
                      ,0x17a,"int Bmcg_ManPerformOne(Gia_Man_t *, Bmc_AndPar_t *)");
      }
      local_5c = f_00;
      for (iVar10 = 0; iVar10 < iVar1; iVar10 = iVar10 + 1) {
        f = iVar10 + f_00;
        i = 0;
        while( true ) {
          iVar1 = pVVar8->nSize - iVar2;
          if (iVar1 <= (int)i) goto LAB_0048310e;
          aVar5 = Abc_Clock();
          p = p_00->pFrames;
          pObj = Gia_ManCo(p,(pGia->vCos->nSize - pGia->nRegs) * local_5c + i);
          iVar2 = Gia_ObjId(p,pObj);
          uVar3 = Vec_IntEntry(local_38,iVar2);
          p_01 = (Bmcg_Man_t *)(ulong)uVar3;
          iLit = Abc_Var2Lit(uVar3,0);
          if ((pPars->nTimeOut != 0) &&
             (aVar6 = Abc_Clock(), (long)pPars->nTimeOut <= (aVar6 - clkStart) / 1000000))
          goto LAB_00483101;
          p_01 = (Bmcg_Man_t *)p_00->pSats[0];
          iVar2 = bmcg_sat_solver_solve(p_01,&iLit,1);
          aVar6 = Abc_Clock();
          p_00->timeSat = p_00->timeSat + (aVar6 - aVar5);
          if (iVar2 != -1) break;
          if (i == ~pGia->nRegs + pGia->vCos->nSize) {
            p_01 = p_00;
            Bmcg_ManPrintFrame(p_00,f,nClauses_00,-1,clkStart);
          }
          if (pPars->pFuncOnFrameDone != (_func_void_int_int_int *)0x0) {
            p_01 = (Bmcg_Man_t *)(ulong)f;
            (*pPars->pFuncOnFrameDone)(f,i,0);
          }
          i = i + 1;
          pVVar8 = pGia->vCos;
          iVar2 = pGia->nRegs;
        }
        if (iVar2 == 1) {
          pPars->iFrame = f;
          pAVar7 = Bmcg_ManGenerateCex(p_00,i,f,0);
          *local_40 = pAVar7;
          pPars->nFailOuts = pPars->nFailOuts + 1;
          p_01 = p_00;
          Bmcg_ManPrintFrame(p_00,f,nClauses_01,-1,clkStart);
          if (pPars->fNotVerbose == 0) {
            uVar3 = pGia->vCos->nSize - pGia->nRegs;
            uVar9 = (ulong)uVar3;
            if (1 < uVar3) {
              uVar9 = 0;
              for (uVar4 = uVar3 - 1; uVar4 != 0; uVar4 = uVar4 / 10) {
                uVar9 = (ulong)((int)uVar9 + 1);
              }
            }
            Abc_Print(uVar3,
                      "Output %*d was asserted in frame %2d (solved %*d out of %*d outputs).  ",
                      uVar9,(ulong)i,(ulong)f,uVar9,(ulong)(uint)pPars->nFailOuts,uVar9,(ulong)uVar3
                     );
            p_01 = _stdout;
            fflush((FILE *)_stdout);
          }
          local_60 = 0;
          if (pPars->pFuncOnFrameDone != (_func_void_int_int_int *)0x0) {
            p_01 = (Bmcg_Man_t *)(ulong)f;
            (*pPars->pFuncOnFrameDone)(f,i,1);
          }
        }
LAB_00483101:
        pVVar8 = pGia->vCos;
        iVar2 = pGia->nRegs;
        iVar1 = pVVar8->nSize - iVar2;
LAB_0048310e:
        if ((int)i < iVar1) {
          iVar1 = pPars->nFramesAdd;
          break;
        }
        iVar1 = pPars->nFramesAdd;
        if (f == pPars->nFramesMax - 1U) break;
        local_5c = local_5c + 1;
      }
      iVar2 = (int)p_01;
      if (iVar10 < iVar1) break;
    }
    f_00 = iVar1 + f_00;
  }
  aVar5 = Abc_Clock();
  p_00->timeOth = aVar5 - (p_00->timeSat + p_00->timeCnf + p_00->timeSmp + p_00->timeUnf + clkStart)
  ;
  if ((local_60 == -1) && (pPars->fNotVerbose == 0)) {
    iVar1 = iVar10 + 1;
    if (pPars->nFramesAdd <= iVar10) {
      iVar1 = 0;
    }
    iVar2 = 0x81bc6f;
    printf("No output failed in %d frames.  ",(ulong)(uint)(iVar1 + f_00));
  }
  aVar5 = Abc_Clock();
  Abc_Print(iVar2,"%s =","Time");
  Abc_Print(iVar2,"%9.2f sec\n",(double)(aVar5 - clkStart) / 1000000.0);
  Bmcg_ManPrintTime(p_00);
  Bmcg_ManStop(p_00);
  return local_60;
}

Assistant:

int Bmcg_ManPerformOne( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    abctime clkStart = Abc_Clock();
    Bmcg_Man_t * p = Bmcg_ManStart( pGia, pPars );
    int f, k = 0, i = Gia_ManPoNum(pGia), status, RetValue = -1, nClauses = 0;
    Abc_CexFreeP( &pGia->pCexSeq );
    for ( f = 0; !pPars->nFramesMax || f < pPars->nFramesMax; f += pPars->nFramesAdd )
    {
        Cnf_Dat_t * pCnf = Bmcg_ManAddNewCnf( p, f, pPars->nFramesAdd );
        if ( pCnf == NULL )
        {
            Bmcg_ManPrintFrame( p, f, nClauses, -1, clkStart );
            if( pPars->pFuncOnFrameDone )
                for ( k = 0; k < pPars->nFramesAdd; k++ )
                for ( i = 0; i < Gia_ManPoNum(pGia); i++ )
                    pPars->pFuncOnFrameDone(f+k, i, 0);
            continue;
        }
        nClauses += pCnf->nClauses;
        Bmcg_ManAddCnf( p, p->pSats[0], pCnf );
        Cnf_DataFree( pCnf );
        assert( Gia_ManPoNum(p->pFrames) == (f + pPars->nFramesAdd) * Gia_ManPoNum(pGia) );
        for ( k = 0; k < pPars->nFramesAdd; k++ )
        {
            for ( i = 0; i < Gia_ManPoNum(pGia); i++ )
            {
                abctime clk = Abc_Clock();
                int iObj = Gia_ObjId( p->pFrames, Gia_ManCo(p->pFrames, (f+k) * Gia_ManPoNum(pGia) + i) );
                int iLit = Abc_Var2Lit( Vec_IntEntry(&p->vFr2Sat, iObj), 0 );
                if ( pPars->nTimeOut && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= pPars->nTimeOut )
                    break;
                status = bmcg_sat_solver_solve( p->pSats[0], &iLit, 1 );
                p->timeSat += Abc_Clock() - clk;
                if ( status == -1 ) // unsat
                {
                    if ( i == Gia_ManPoNum(pGia)-1 )
                        Bmcg_ManPrintFrame( p, f+k, nClauses, -1, clkStart );
                    if( pPars->pFuncOnFrameDone)
                        pPars->pFuncOnFrameDone(f+k, i, 0);
                    continue;
                }
                if ( status == 1 ) // sat
                {
                    RetValue = 0;
                    pPars->iFrame = f+k;
                    pGia->pCexSeq = Bmcg_ManGenerateCex( p, i, f+k, 0 );
                    pPars->nFailOuts++;
                    Bmcg_ManPrintFrame( p, f+k, nClauses, -1, clkStart );
                    if ( !pPars->fNotVerbose )
                    {
                        int nOutDigits = Abc_Base10Log( Gia_ManPoNum(pGia) );
                        Abc_Print( 1, "Output %*d was asserted in frame %2d (solved %*d out of %*d outputs).  ",  
                            nOutDigits, i, f+k, nOutDigits, pPars->nFailOuts, nOutDigits, Gia_ManPoNum(pGia) );
                        fflush( stdout );
                    }
                    if( pPars->pFuncOnFrameDone )
                        pPars->pFuncOnFrameDone(f+k, i, 1);
                }
                break;
            }
            if ( i < Gia_ManPoNum(pGia) || f+k == pPars->nFramesMax-1 )
                break;
        }
        if ( k < pPars->nFramesAdd )
            break;
    }
    p->timeOth = Abc_Clock() - clkStart - p->timeUnf - p->timeCnf - p->timeSmp - p->timeSat;
    if ( RetValue == -1 && !pPars->fNotVerbose )
        printf( "No output failed in %d frames.  ", f + (k < pPars->nFramesAdd ? k+1 : 0) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    Bmcg_ManPrintTime( p );
    Bmcg_ManStop( p );
    return RetValue;
}